

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void Acb_IntallLibrary(void)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint *__ptr;
  void *pvVar4;
  size_t sVar5;
  Mio_Library_t *pLib;
  char *pName;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar4 = malloc(1000);
  *(void **)(__ptr + 2) = pvVar4;
  if (pLibStr[0] != (char *)0x0) {
    lVar8 = 0;
    pcVar9 = pLibStr[0];
    do {
      sVar5 = strlen(pcVar9);
      if (0 < (int)(uint)sVar5) {
        uVar6 = *__ptr;
        uVar2 = __ptr[1];
        pvVar4 = *(void **)(__ptr + 2);
        uVar7 = 0;
        do {
          cVar1 = pcVar9[uVar7];
          if ((int)uVar7 + uVar2 == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (pvVar4 == (void *)0x0) {
                pvVar4 = malloc(0x10);
              }
              else {
                pvVar4 = realloc(pvVar4,0x10);
              }
              uVar6 = 0x10;
            }
            else {
              uVar3 = uVar6 * 2;
              if (SBORROW4(uVar6,uVar3) != 0 < (int)uVar6) {
                uVar6 = uVar3;
                if (pvVar4 == (void *)0x0) {
                  pvVar4 = malloc((ulong)uVar3);
                }
                else {
                  pvVar4 = realloc(pvVar4,(ulong)uVar3);
                }
              }
            }
          }
          *(char *)((long)pvVar4 + uVar7 + (long)(int)uVar2) = cVar1;
          uVar7 = uVar7 + 1;
        } while (((uint)sVar5 & 0x7fffffff) != uVar7);
        __ptr[1] = uVar2 + (int)uVar7;
        *__ptr = uVar6;
        *(void **)(__ptr + 2) = pvVar4;
      }
      pcVar9 = pLibStr[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (pcVar9 != (char *)0x0);
  }
  uVar6 = __ptr[1];
  uVar2 = *__ptr;
  if (uVar6 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
      }
      sVar5 = 0x10;
    }
    else {
      sVar5 = (ulong)uVar2 * 2;
      if ((int)sVar5 <= (int)uVar2) goto LAB_0036b33e;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(sVar5);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),sVar5);
      }
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = (uint)sVar5;
  }
LAB_0036b33e:
  pcVar9 = *(char **)(__ptr + 2);
  __ptr[1] = uVar6 + 1;
  pcVar9[(int)uVar6] = '\0';
  pLib = Mio_LibraryReadBuffer(pcVar9,0,(st__table *)0x0,0);
  pName = (char *)malloc(0xf);
  builtin_strncpy(pName,"iccad17.genlib",0xf);
  Mio_LibrarySetName(pLib,pName);
  Mio_UpdateGenlib(pLib);
  if (pcVar9 != (char *)0x0) {
    free(pcVar9);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Acb_IntallLibrary()
{
    extern Mio_Library_t * Mio_LibraryReadBuffer( char * pBuffer, int fExtendedFormat, st__table * tExcludeGate, int fVerbose );
    Mio_Library_t * pLib;
    int i;
    // create library string
    Vec_Str_t * vLibStr = Vec_StrAlloc( 1000 );
    for ( i = 0; pLibStr[i]; i++ )
        Vec_StrAppend( vLibStr, pLibStr[i] );
    Vec_StrPush( vLibStr, '\0' );
    // create library
    pLib = Mio_LibraryReadBuffer( Vec_StrArray(vLibStr), 0, NULL, 0 );
    Mio_LibrarySetName( pLib, Abc_UtilStrsav("iccad17.genlib") );
    Mio_UpdateGenlib( pLib );
    Vec_StrFree( vLibStr );
}